

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O0

StencilOp vkt::pipeline::mapVkStencilOp(VkStencilOp stencilOp)

{
  StencilOp local_c;
  VkStencilOp stencilOp_local;
  
  switch(stencilOp) {
  case VK_STENCIL_OP_KEEP:
    local_c = STENCILOP_KEEP;
    break;
  case VK_STENCIL_OP_ZERO:
    local_c = STENCILOP_ZERO;
    break;
  case VK_STENCIL_OP_REPLACE:
    local_c = STENCILOP_REPLACE;
    break;
  case VK_STENCIL_OP_INCREMENT_AND_CLAMP:
    local_c = STENCILOP_INCR;
    break;
  case VK_STENCIL_OP_DECREMENT_AND_CLAMP:
    local_c = STENCILOP_DECR;
    break;
  case VK_STENCIL_OP_INVERT:
    local_c = STENCILOP_INVERT;
    break;
  case VK_STENCIL_OP_INCREMENT_AND_WRAP:
    local_c = STENCILOP_INCR_WRAP;
    break;
  case VK_STENCIL_OP_DECREMENT_AND_WRAP:
    local_c = STENCILOP_DECR_WRAP;
    break;
  default:
    local_c = STENCILOP_LAST;
  }
  return local_c;
}

Assistant:

rr::StencilOp mapVkStencilOp (vk::VkStencilOp stencilOp)
{
	switch (stencilOp)
	{
		case VK_STENCIL_OP_KEEP:					return rr::STENCILOP_KEEP;
		case VK_STENCIL_OP_ZERO:					return rr::STENCILOP_ZERO;
		case VK_STENCIL_OP_REPLACE:					return rr::STENCILOP_REPLACE;
		case VK_STENCIL_OP_INCREMENT_AND_CLAMP:		return rr::STENCILOP_INCR;
		case VK_STENCIL_OP_DECREMENT_AND_CLAMP:		return rr::STENCILOP_DECR;
		case VK_STENCIL_OP_INVERT:					return rr::STENCILOP_INVERT;
		case VK_STENCIL_OP_INCREMENT_AND_WRAP:		return rr::STENCILOP_INCR_WRAP;
		case VK_STENCIL_OP_DECREMENT_AND_WRAP:		return rr::STENCILOP_DECR_WRAP;
		default:
			DE_ASSERT(false);
	}
	return rr::STENCILOP_LAST;
}